

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# i2p.cpp
# Opt level: O0

bool __thiscall i2p::sam::Session::Accept(Session *this,Connection *conn)

{
  long lVar1;
  string_view source_file;
  string_view source_file_00;
  string_view logging_function;
  string_view logging_function_00;
  undefined1 uVar2;
  uint uVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__str;
  pointer pSVar4;
  ConstevalFormatString<2U> in_RSI;
  LogFlags in_RDI;
  long in_FS_OFFSET;
  runtime_error *e_1;
  runtime_error *e;
  bool disconnect;
  Event occurred;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock9;
  CNetAddr peer_addr;
  string peer_dest;
  string errmsg;
  undefined4 in_stack_fffffffffffffdd8;
  undefined2 in_stack_fffffffffffffddc;
  uint16_t in_stack_fffffffffffffdde;
  CService *in_stack_fffffffffffffde0;
  CService *in_stack_fffffffffffffde8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffdf0;
  undefined4 in_stack_fffffffffffffdf8;
  undefined4 in_stack_fffffffffffffdfc;
  undefined7 in_stack_fffffffffffffe08;
  undefined1 in_stack_fffffffffffffe0f;
  undefined5 in_stack_fffffffffffffe18;
  undefined1 in_stack_fffffffffffffe1d;
  undefined1 in_stack_fffffffffffffe1e;
  undefined7 in_stack_fffffffffffffe38;
  undefined8 in_stack_fffffffffffffe48;
  int source_line;
  LogFlags LVar5;
  undefined7 in_stack_fffffffffffffe98;
  undefined1 in_stack_fffffffffffffe9f;
  byte bVar6;
  size_t in_stack_fffffffffffffea0;
  char *in_stack_fffffffffffffea8;
  undefined8 local_118;
  undefined8 local_110;
  char local_101 [129];
  Level in_stack_ffffffffffffff80;
  char **in_stack_ffffffffffffff90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff98;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  LVar5 = in_RDI;
  AssertLockNotHeldInline
            ((char *)in_stack_fffffffffffffde8,(char *)in_stack_fffffffffffffde0,
             CONCAT22(in_stack_fffffffffffffdde,in_stack_fffffffffffffddc),(Mutex *)0x910708);
  std::__cxx11::string::string(in_stack_fffffffffffffdf0);
  do {
    uVar2 = CThreadInterrupt::operator_cast_to_bool
                      ((CThreadInterrupt *)
                       CONCAT26(in_stack_fffffffffffffdde,
                                CONCAT24(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8)));
    source_line = (int)((ulong)in_stack_fffffffffffffe48 >> 0x20);
    if (((uVar2 ^ 0xff) & 1) == 0) {
LAB_00910b3e:
      uVar2 = CThreadInterrupt::operator_cast_to_bool
                        ((CThreadInterrupt *)
                         CONCAT26(in_stack_fffffffffffffdde,
                                  CONCAT24(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8)));
      if ((bool)uVar2) {
        in_stack_fffffffffffffe1e =
             ::LogAcceptCategory(CONCAT26(in_stack_fffffffffffffdde,
                                          CONCAT24(in_stack_fffffffffffffddc,
                                                   in_stack_fffffffffffffdd8)),Trace);
        if ((bool)in_stack_fffffffffffffe1e) {
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    ((basic_string_view<char,_std::char_traits<char>_> *)
                     CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8),
                     (char *)in_stack_fffffffffffffdf0);
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    ((basic_string_view<char,_std::char_traits<char>_> *)
                     CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8),
                     (char *)in_stack_fffffffffffffdf0);
          in_stack_fffffffffffffdd8 = 1;
          logging_function._M_str = in_stack_fffffffffffffea8;
          logging_function._M_len = in_stack_fffffffffffffea0;
          source_file._M_str._0_7_ = in_stack_fffffffffffffe98;
          source_file._M_len = LVar5;
          source_file._M_str._7_1_ = in_stack_fffffffffffffe9f;
          LogPrintFormatInternal<>
                    (logging_function,source_file,source_line,in_RDI,in_stack_ffffffffffffff80,
                     (ConstevalFormatString<0U>)in_RSI.fmt);
        }
      }
      else {
        in_stack_fffffffffffffe1d =
             ::LogAcceptCategory(CONCAT26(in_stack_fffffffffffffdde,
                                          CONCAT24(in_stack_fffffffffffffddc,
                                                   in_stack_fffffffffffffdd8)),Trace);
        if ((bool)in_stack_fffffffffffffe1d) {
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    ((basic_string_view<char,_std::char_traits<char>_> *)
                     CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8),
                     (char *)in_stack_fffffffffffffdf0);
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    ((basic_string_view<char,_std::char_traits<char>_> *)
                     CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8),
                     (char *)in_stack_fffffffffffffdf0);
          in_stack_fffffffffffffdd8 = 1;
          logging_function_00._M_str = in_stack_fffffffffffffea8;
          logging_function_00._M_len = (size_t)"";
          source_file_00._M_str._0_7_ = in_stack_fffffffffffffe98;
          source_file_00._M_len = LVar5;
          source_file_00._M_str._7_1_ = in_stack_fffffffffffffe9f;
          LogPrintFormatInternal<char_const*,std::__cxx11::string>
                    (logging_function_00,source_file_00,0,in_RDI,in_stack_ffffffffffffff80,in_RSI,
                     in_stack_ffffffffffffff90,in_stack_ffffffffffffff98);
        }
      }
      CheckControlSock((Session *)
                       CONCAT17(uVar2,CONCAT16(in_stack_fffffffffffffe1e,
                                               CONCAT15(in_stack_fffffffffffffe1d,
                                                        in_stack_fffffffffffffe18))));
      bVar6 = 0;
      goto LAB_00910d96;
    }
    __str = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            std::unique_ptr<Sock,_std::default_delete<Sock>_>::operator->
                      ((unique_ptr<Sock,_std::default_delete<Sock>_> *)
                       CONCAT26(in_stack_fffffffffffffdde,
                                CONCAT24(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8)));
    std::chrono::duration<long,std::ratio<1l,1000l>>::duration<long,std::ratio<1l,1l>,void>
              ((duration<long,_std::ratio<1L,_1000L>_> *)in_stack_fffffffffffffde0,
               (duration<long,_std::ratio<1L,_1L>_> *)
               CONCAT26(in_stack_fffffffffffffdde,
                        CONCAT24(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8)));
    uVar3 = (**(_func_int **)((long)(__str->_M_dataplus)._M_p + 0x70))(__str,local_110,1,local_101);
    source_line = (int)((ulong)in_stack_fffffffffffffe48 >> 0x20);
    if ((uVar3 & 1) == 0) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffde8,(char *)in_stack_fffffffffffffde0);
      goto LAB_00910b3e;
    }
  } while (local_101[0] == '\0');
  std::__cxx11::string::string(in_stack_fffffffffffffdf0);
  pSVar4 = std::unique_ptr<Sock,_std::default_delete<Sock>_>::operator->
                     ((unique_ptr<Sock,_std::default_delete<Sock>_> *)
                      CONCAT26(in_stack_fffffffffffffdde,
                               CONCAT24(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8)));
  std::chrono::duration<long,std::ratio<1l,1000l>>::duration<long,std::ratio<1l,1l>,void>
            ((duration<long,_std::ratio<1L,_1000L>_> *)in_stack_fffffffffffffde0,
             (duration<long,_std::ratio<1L,_1L>_> *)
             CONCAT26(in_stack_fffffffffffffdde,
                      CONCAT24(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8)));
  (*pSVar4->_vptr_Sock[0x12])
            (&stack0xffffffffffffff98,pSVar4,10,local_118,
             *(undefined8 *)(in_RDI + (WALLETDB|ZMQ|BENCH|HTTP)),0x10000);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(uVar2,in_stack_fffffffffffffe38),__str);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT26(in_stack_fffffffffffffdde,
                      CONCAT24(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8)));
  CNetAddr::CNetAddr(&in_stack_fffffffffffffde0->super_CNetAddr);
  DestB64ToAddr((string *)CONCAT17(in_stack_fffffffffffffe0f,in_stack_fffffffffffffe08));
  CNetAddr::operator=(&in_stack_fffffffffffffde8->super_CNetAddr,
                      &in_stack_fffffffffffffde0->super_CNetAddr);
  CNetAddr::~CNetAddr((CNetAddr *)
                      CONCAT26(in_stack_fffffffffffffdde,
                               CONCAT24(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8)));
  CService::CService(in_stack_fffffffffffffde8,&in_stack_fffffffffffffde0->super_CNetAddr,
                     in_stack_fffffffffffffdde);
  CService::operator=(in_stack_fffffffffffffde8,in_stack_fffffffffffffde0);
  CService::~CService((CService *)
                      CONCAT26(in_stack_fffffffffffffdde,
                               CONCAT24(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8)));
  bVar6 = 1;
  CNetAddr::~CNetAddr((CNetAddr *)
                      CONCAT26(in_stack_fffffffffffffdde,
                               CONCAT24(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8)));
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT26(in_stack_fffffffffffffdde,
                      CONCAT24(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8)));
LAB_00910d96:
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT26(in_stack_fffffffffffffdde,
                      CONCAT24(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8)));
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (bool)(bVar6 & 1);
  }
  __stack_chk_fail();
}

Assistant:

bool Session::Accept(Connection& conn)
{
    AssertLockNotHeld(m_mutex);

    std::string errmsg;
    bool disconnect{false};

    while (!*m_interrupt) {
        Sock::Event occurred;
        if (!conn.sock->Wait(MAX_WAIT_FOR_IO, Sock::RECV, &occurred)) {
            errmsg = "wait on socket failed";
            break;
        }

        if (occurred == 0) {
            // Timeout, no incoming connections or errors within MAX_WAIT_FOR_IO.
            continue;
        }

        std::string peer_dest;
        try {
            peer_dest = conn.sock->RecvUntilTerminator('\n', MAX_WAIT_FOR_IO, *m_interrupt, MAX_MSG_SIZE);
        } catch (const std::runtime_error& e) {
            errmsg = e.what();
            break;
        }

        CNetAddr peer_addr;
        try {
            peer_addr = DestB64ToAddr(peer_dest);
        } catch (const std::runtime_error& e) {
            // The I2P router is expected to send the Base64 of the connecting peer,
            // but it may happen that something like this is sent instead:
            // STREAM STATUS RESULT=I2P_ERROR MESSAGE="Session was closed"
            // In that case consider the session damaged and close it right away,
            // even if the control socket is alive.
            if (peer_dest.find("RESULT=I2P_ERROR") != std::string::npos) {
                errmsg = strprintf("unexpected reply that hints the session is unusable: %s", peer_dest);
                disconnect = true;
            } else {
                errmsg = e.what();
            }
            break;
        }

        conn.peer = CService(peer_addr, I2P_SAM31_PORT);

        return true;
    }

    if (*m_interrupt) {
        LogPrintLevel(BCLog::I2P, BCLog::Level::Debug, "Accept was interrupted\n");
    } else {
        LogPrintLevel(BCLog::I2P, BCLog::Level::Debug, "Error accepting%s: %s\n", disconnect ? " (will close the session)" : "", errmsg);
    }
    if (disconnect) {
        LOCK(m_mutex);
        Disconnect();
    } else {
        CheckControlSock();
    }
    return false;
}